

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall
bloaty::Bloaty::DisassembleFunction
          (Bloaty *this,string_view function,Options *options,RollupOutput *output)

{
  string_view value;
  string_view format;
  Arg *pAVar1;
  char *pcVar2;
  bool bVar3;
  DataSource DVar4;
  uint uVar5;
  char *in_RDX;
  Arg *in_RSI;
  long in_RDI;
  DisassemblyInfo *in_R8;
  unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> file;
  InputFileInfo *file_info;
  iterator __end1;
  iterator __begin1;
  vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_> *__range1;
  DisassemblyInfo info;
  DisassemblyInfo *in_stack_00000698;
  Options *in_stack_fffffffffffffe28;
  DisassemblyInfo *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  pointer in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe68;
  RollupOutput *in_stack_fffffffffffffe70;
  string_view in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffed0;
  uint in_stack_fffffffffffffed4;
  Bloaty *in_stack_fffffffffffffed8;
  __normal_iterator<bloaty::Bloaty::InputFileInfo_*,_std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>_>
  local_b8;
  long local_b0;
  undefined1 local_a8 [128];
  DisassemblyInfo *local_28;
  Arg *local_10;
  char *pcStack_8;
  
  local_28 = in_R8;
  local_10 = in_RSI;
  pcStack_8 = in_RDX;
  DisassemblyInfo::DisassemblyInfo(in_stack_fffffffffffffe30);
  local_b0 = in_RDI + 0x148;
  local_b8._M_current =
       (InputFileInfo *)
       std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>::
       begin((vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
              *)in_stack_fffffffffffffe28);
  std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>::end
            ((vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
              *)in_stack_fffffffffffffe28);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<bloaty::Bloaty::InputFileInfo_*,_std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>_>
                        *)in_stack_fffffffffffffe30,
                       (__normal_iterator<bloaty::Bloaty::InputFileInfo_*,_std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>_>
                        *)in_stack_fffffffffffffe28);
    if (!bVar3) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe40,
                 (char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      value._M_str = pcStack_8;
      value._M_len = (size_t)local_10;
      absl::substitute_internal::Arg::Arg((Arg *)&stack0xfffffffffffffe70,value);
      format._M_str = in_stack_fffffffffffffe68;
      format._M_len = (size_t)pcStack_8;
      absl::Substitute_abi_cxx11_(format,local_10);
      std::__cxx11::string::c_str();
      Throw((char *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
    }
    __gnu_cxx::
    __normal_iterator<bloaty::Bloaty::InputFileInfo_*,_std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>_>
    ::operator*(&local_b8);
    GetObjectFile(in_stack_fffffffffffffed8,
                  (string *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    in_stack_fffffffffffffe40 =
         std::unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>::operator->
                   ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)
                    0x19ed82);
    pcVar2 = pcStack_8;
    pAVar1 = local_10;
    DVar4 = EffectiveSymbolSource(in_stack_fffffffffffffe28);
    uVar5 = (*in_stack_fffffffffffffe40->_vptr_ObjectFile[4])
                      (in_stack_fffffffffffffe40,pAVar1,pcVar2,(ulong)DVar4,local_a8);
    in_stack_fffffffffffffe3c = CONCAT13((char)uVar5,(int3)in_stack_fffffffffffffe3c);
    bVar3 = (uVar5 & 1) != 0;
    if (bVar3) {
      in_stack_fffffffffffffe30 = local_28;
      DisassembleFunction_abi_cxx11_(in_stack_00000698);
      std::__cxx11::string::operator_cast_to_basic_string_view((string *)&stack0xfffffffffffffed8);
      RollupOutput::SetDisassembly(in_stack_fffffffffffffe70,in_stack_fffffffffffffe78);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffed8);
    }
    in_stack_fffffffffffffed4 = (uint)bVar3;
    std::unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>::~unique_ptr
              ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)
               in_stack_fffffffffffffe30);
    if (in_stack_fffffffffffffed4 != 0) break;
    __gnu_cxx::
    __normal_iterator<bloaty::Bloaty::InputFileInfo_*,_std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>_>
    ::operator++(&local_b8);
  }
  DisassemblyInfo::~DisassemblyInfo((DisassemblyInfo *)0x19efa0);
  return;
}

Assistant:

void Bloaty::DisassembleFunction(string_view function, const Options& options,
                                 RollupOutput* output) {
  DisassemblyInfo info;
  for (const auto& file_info : input_files_) {
    auto file = GetObjectFile(file_info.filename_);
    if (file->GetDisassemblyInfo(function, EffectiveSymbolSource(options),
                                 &info)) {
      output->SetDisassembly(::bloaty::DisassembleFunction(info));
      return;
    }
  }

  THROWF("Couldn't find function $0 to disassemble", function);
}